

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

bool __thiscall hwnet::Poller::Init(Poller *this,ThreadPool *pool)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ThreadPool *pTVar4;
  notifyChannel *this_00;
  element_type *this_01;
  shared_ptr<hwnet::Poller::notifyChannel> local_58;
  shared_ptr<hwnet::Poller::notifyChannel> local_48;
  bool local_35 [8];
  bool expected;
  byte local_21;
  ThreadPool *pTStack_20;
  bool poolCreateByNew_;
  ThreadPool *pool_local;
  Poller *this_local;
  
  local_21 = 0;
  pTStack_20 = pool;
  pool_local = (ThreadPool *)this;
  if (pool == (ThreadPool *)0x0) {
    pTVar4 = (ThreadPool *)operator_new(0xe0);
    ThreadPool::ThreadPool(pTVar4);
    pTStack_20 = pTVar4;
    iVar2 = std::thread::hardware_concurrency();
    ThreadPool::Init(pTVar4,iVar2 << 1,0);
  }
  local_35[0] = false;
  local_21 = pool == (ThreadPool *)0x0;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->inited,local_35,true,memory_order_seq_cst);
  pTVar4 = pTStack_20;
  if (bVar1) {
    this->pool_ = pTStack_20;
    bVar1 = Epoll::Init(&this->poller_);
    pTVar4 = pTStack_20;
    if (bVar1) {
      this_00 = (notifyChannel *)operator_new(0x28);
      notifyChannel::notifyChannel(this_00);
      std::shared_ptr<hwnet::Poller::notifyChannel>::shared_ptr<hwnet::Poller::notifyChannel,void>
                (&local_48,this_00);
      std::shared_ptr<hwnet::Poller::notifyChannel>::operator=(&this->notifyChannel_,&local_48);
      std::shared_ptr<hwnet::Poller::notifyChannel>::~shared_ptr(&local_48);
      this_01 = std::
                __shared_ptr_access<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->notifyChannel_);
      uVar3 = notifyChannel::init(this_01,(EVP_PKEY_CTX *)this);
      pTVar4 = pTStack_20;
      if ((uVar3 & 1) == 0) {
        if (((local_21 & 1) != 0) && (pTStack_20 != (ThreadPool *)0x0)) {
          ThreadPool::~ThreadPool(pTStack_20);
          operator_delete(pTVar4,0xe0);
        }
        this->pool_ = (ThreadPool *)0x0;
        std::shared_ptr<hwnet::Poller::notifyChannel>::shared_ptr(&local_58,(nullptr_t)0x0);
        std::shared_ptr<hwnet::Poller::notifyChannel>::operator=(&this->notifyChannel_,&local_58);
        std::shared_ptr<hwnet::Poller::notifyChannel>::~shared_ptr(&local_58);
        this_local._7_1_ = false;
      }
      else {
        this->poolCreateByNew = (bool)(local_21 & 1);
        this_local._7_1_ = true;
      }
    }
    else {
      if (((local_21 & 1) != 0) && (pTStack_20 != (ThreadPool *)0x0)) {
        ThreadPool::~ThreadPool(pTStack_20);
        operator_delete(pTVar4,0xe0);
      }
      this->pool_ = (ThreadPool *)0x0;
      this_local._7_1_ = false;
    }
  }
  else {
    if (((local_21 & 1) != 0) && (pTStack_20 != (ThreadPool *)0x0)) {
      ThreadPool::~ThreadPool(pTStack_20);
      operator_delete(pTVar4,0xe0);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Poller::Init(ThreadPool *pool) {

	auto poolCreateByNew_ = false;

	if(nullptr == pool) {
		pool = new ThreadPool;
		pool->Init(std::thread::hardware_concurrency()*2);
		poolCreateByNew_ = true;
	}

	bool expected = false;
	if(!this->inited.compare_exchange_strong(expected,true)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		return false;
	}

	this->pool_ = pool;

	if(!poller_.Init()) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		return false;
	}

	this->notifyChannel_ = notifyChannel::Ptr(new notifyChannel);

	if(!this->notifyChannel_->init(this)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		this->notifyChannel_ = nullptr;
		return false;
	}

	this->poolCreateByNew = poolCreateByNew_;

	return true;	
}